

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O0

void __thiscall DHUDMessage::Serialize(DHUDMessage *this,FArchive *arc)

{
  bool bVar1;
  FArchive *pFVar2;
  FArchive *arc_local;
  DHUDMessage *this_local;
  
  DObject::Serialize(&this->super_DObject,arc);
  pFVar2 = FArchive::operator<<(arc,&this->Left);
  pFVar2 = FArchive::operator<<(pFVar2,&this->Top);
  pFVar2 = FArchive::operator<<(pFVar2,&this->CenterX);
  pFVar2 = FArchive::operator<<(pFVar2,&this->HoldTics);
  pFVar2 = FArchive::operator<<(pFVar2,&this->Tics);
  pFVar2 = FArchive::operator<<(pFVar2,&this->State);
  pFVar2 = ::operator<<(pFVar2,&this->TextColor);
  pFVar2 = FArchive::operator<<(pFVar2,&this->SBarID);
  pFVar2 = FArchive::operator<<(pFVar2,&this->SourceText);
  pFVar2 = ::operator<<(pFVar2,&this->Font);
  pFVar2 = ::operator<<(pFVar2,&this->Next);
  pFVar2 = FArchive::operator<<(pFVar2,&this->HUDWidth);
  pFVar2 = FArchive::operator<<(pFVar2,&this->HUDHeight);
  pFVar2 = FArchive::operator<<(pFVar2,&this->NoWrap);
  pFVar2 = FArchive::operator<<(pFVar2,&this->ClipX);
  pFVar2 = FArchive::operator<<(pFVar2,&this->ClipY);
  pFVar2 = FArchive::operator<<(pFVar2,&this->ClipWidth);
  pFVar2 = FArchive::operator<<(pFVar2,&this->ClipHeight);
  pFVar2 = FArchive::operator<<(pFVar2,&this->WrapWidth);
  pFVar2 = FArchive::operator<<(pFVar2,&this->HandleAspect);
  pFVar2 = FArchive::operator<<(pFVar2,&this->VisibilityFlags);
  pFVar2 = ::operator<<(pFVar2,&this->Style);
  FArchive::operator<<(pFVar2,&this->Alpha);
  bVar1 = FArchive::IsLoading(arc);
  if (bVar1) {
    this->Lines = (FBrokenLines *)0x0;
    (*(this->super_DObject)._vptr_DObject[7])(this,this->SourceText);
  }
  return;
}

Assistant:

void DHUDMessage::Serialize(FArchive &arc)
{
	Super::Serialize(arc);
	arc << Left << Top << CenterX << HoldTics
		<< Tics << State << TextColor
		<< SBarID << SourceText << Font << Next
		<< HUDWidth << HUDHeight
		<< NoWrap
		<< ClipX << ClipY << ClipWidth << ClipHeight
		<< WrapWidth
		<< HandleAspect
		<< VisibilityFlags
		<< Style << Alpha;
	if (arc.IsLoading())
	{
		Lines = NULL;
		ResetText(SourceText);
	}
}